

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BristolCircuit.cpp
# Opt level: O0

void __thiscall
Circuit::base_circuit_shares
          (Circuit *this,
          vector<std::array<unsigned_long,_1UL>,_std::allocator<std::array<unsigned_long,_1UL>_>_>
          *witness_shares_in,
          vector<std::array<unsigned_long,_1UL>,_std::allocator<std::array<unsigned_long,_1UL>_>_>
          *output_mult_shares,
          vector<std::array<unsigned_long,_1UL>,_std::allocator<std::array<unsigned_long,_1UL>_>_>
          *witness_shares_out,
          vector<std::array<unsigned_long,_1UL>,_std::allocator<std::array<unsigned_long,_1UL>_>_>
          *right_input_mult_shares_out,
          vector<std::array<unsigned_long,_1UL>,_std::allocator<std::array<unsigned_long,_1UL>_>_>
          *left_input_mult_shares_out)

{
  uint uVar1;
  value_type_conflict3 vVar2;
  value_type vVar3;
  ulong uVar4;
  bool bVar5;
  size_type sVar6;
  const_reference pvVar7;
  const_reference pvVar8;
  reference pvVar9;
  const_reference pvVar10;
  const_reference pvVar11;
  reference pvVar12;
  const_reference this_00;
  runtime_error *this_01;
  ulong uVar13;
  allocator_type *paVar14;
  vector<std::array<unsigned_long,_1UL>,_std::allocator<std::array<unsigned_long,_1UL>_>_> *in_RCX;
  vector<std::array<unsigned_long,_1UL>,_std::allocator<std::array<unsigned_long,_1UL>_>_> *in_RDX;
  vector<std::array<unsigned_long,_1UL>,_std::allocator<std::array<unsigned_long,_1UL>_>_> *in_RSI;
  uint *in_RDI;
  vector<std::array<unsigned_long,_1UL>,_std::allocator<std::array<unsigned_long,_1UL>_>_> *in_R8;
  vector<std::array<unsigned_long,_1UL>,_std::allocator<std::array<unsigned_long,_1UL>_>_> *in_R9;
  uint j_2;
  uint i_3;
  uint i_2;
  uint cntOut;
  uint j_1;
  uint i_1;
  uint j;
  uint i;
  uint cnt;
  uint cntAND;
  uint p;
  vector<unsigned_long,_std::allocator<unsigned_long>_> W;
  size_type in_stack_fffffffffffffea8;
  array<unsigned_long,_1UL> *in_stack_fffffffffffffeb0;
  allocator_type *in_stack_fffffffffffffec0;
  size_type in_stack_fffffffffffffec8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_fffffffffffffed0;
  uint local_88;
  uint local_84;
  uint local_80;
  uint local_7c;
  uint local_78;
  uint local_74;
  uint local_70;
  uint local_6c;
  uint local_68;
  uint local_64;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_48;
  vector<std::array<unsigned_long,_1UL>,_std::allocator<std::array<unsigned_long,_1UL>_>_> *local_30
  ;
  vector<std::array<unsigned_long,_1UL>,_std::allocator<std::array<unsigned_long,_1UL>_>_> *local_28
  ;
  vector<std::array<unsigned_long,_1UL>,_std::allocator<std::array<unsigned_long,_1UL>_>_> *local_20
  ;
  vector<std::array<unsigned_long,_1UL>,_std::allocator<std::array<unsigned_long,_1UL>_>_> *local_18
  ;
  vector<std::array<unsigned_long,_1UL>,_std::allocator<std::array<unsigned_long,_1UL>_>_> *local_10
  ;
  
  local_30 = in_R9;
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)0x1085f6);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,in_stack_fffffffffffffec0);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)0x108622);
  bVar5 = false;
  do {
    if (bVar5) {
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffec0)
      ;
      return;
    }
    local_64 = 0;
    local_68 = 0;
    for (local_6c = 0;
        sVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                          ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(in_RDI + 2)),
        local_6c < sVar6; local_6c = local_6c + 1) {
      for (local_70 = 0;
          pvVar7 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                             ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(in_RDI + 2),
                              (ulong)local_6c), local_70 < *pvVar7; local_70 = local_70 + 1) {
        std::
        vector<std::array<unsigned_long,_1UL>,_std::allocator<std::array<unsigned_long,_1UL>_>_>::
        operator[](local_10,(ulong)local_68);
        pvVar8 = std::array<unsigned_long,_1UL>::operator[]
                           (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
        vVar2 = *pvVar8;
        pvVar9 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                           (&local_48,(ulong)local_68);
        *pvVar9 = vVar2;
        local_68 = local_68 + 1;
      }
    }
    for (local_74 = 0;
        sVar6 = std::vector<GateType,_std::allocator<GateType>_>::size
                          ((vector<GateType,_std::allocator<GateType>_> *)(in_RDI + 0xe)),
        local_74 < sVar6; local_74 = local_74 + 1) {
      pvVar10 = std::vector<GateType,_std::allocator<GateType>_>::operator[]
                          ((vector<GateType,_std::allocator<GateType>_> *)(in_RDI + 0xe),
                           (ulong)local_74);
      if (*pvVar10 == AND) {
        pvVar11 = std::
                  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                  ::operator[]((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                                *)(in_RDI + 0x14),(ulong)local_74);
        pvVar7 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](pvVar11,0);
        pvVar9 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                           (&local_48,(ulong)*pvVar7);
        vVar3 = *pvVar9;
        std::
        vector<std::array<unsigned_long,_1UL>,_std::allocator<std::array<unsigned_long,_1UL>_>_>::
        operator[](local_28,(ulong)local_64);
        pvVar12 = std::array<unsigned_long,_1UL>::operator[]
                            (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
        *pvVar12 = vVar3;
        pvVar11 = std::
                  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                  ::operator[]((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                                *)(in_RDI + 0x14),(ulong)local_74);
        pvVar7 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](pvVar11,1);
        pvVar9 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                           (&local_48,(ulong)*pvVar7);
        vVar3 = *pvVar9;
        std::
        vector<std::array<unsigned_long,_1UL>,_std::allocator<std::array<unsigned_long,_1UL>_>_>::
        operator[](local_30,(ulong)local_64);
        pvVar12 = std::array<unsigned_long,_1UL>::operator[]
                            (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
        *pvVar12 = vVar3;
        std::
        vector<std::array<unsigned_long,_1UL>,_std::allocator<std::array<unsigned_long,_1UL>_>_>::
        operator[](local_18,(ulong)local_64);
        pvVar8 = std::array<unsigned_long,_1UL>::operator[]
                           (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
        vVar2 = *pvVar8;
        pvVar11 = std::
                  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                  ::operator[]((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                                *)(in_RDI + 0x1a),(ulong)local_74);
        pvVar7 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](pvVar11,0);
        pvVar9 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                           (&local_48,(ulong)*pvVar7);
        *pvVar9 = vVar2;
        local_64 = local_64 + 1;
      }
      else {
        pvVar10 = std::vector<GateType,_std::allocator<GateType>_>::operator[]
                            ((vector<GateType,_std::allocator<GateType>_> *)(in_RDI + 0xe),
                             (ulong)local_74);
        if (*pvVar10 == MAND) {
          local_78 = 0;
          while( true ) {
            pvVar11 = std::
                      vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                      ::operator[]((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                                    *)(in_RDI + 0x1a),(ulong)local_74);
            sVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(pvVar11);
            if (sVar6 <= local_78) break;
            pvVar11 = std::
                      vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                      ::operator[]((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                                    *)(in_RDI + 0x14),(ulong)local_74);
            pvVar7 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                               (pvVar11,(ulong)local_78);
            pvVar9 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                               (&local_48,(ulong)*pvVar7);
            uVar13 = *pvVar9;
            pvVar11 = std::
                      vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                      ::operator[]((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                                    *)(in_RDI + 0x14),(ulong)local_74);
            this_00 = std::
                      vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                      ::operator[]((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                                    *)(in_RDI + 0x1a),(ulong)local_74);
            sVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(this_00);
            pvVar7 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                               (pvVar11,local_78 + sVar6);
            pvVar9 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                               (&local_48,(ulong)*pvVar7);
            uVar4 = *pvVar9;
            pvVar11 = std::
                      vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                      ::operator[]((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                                    *)(in_RDI + 0x1a),(ulong)local_74);
            pvVar7 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                               (pvVar11,(ulong)local_78);
            pvVar9 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                               (&local_48,(ulong)*pvVar7);
            *pvVar9 = uVar13 & uVar4;
            local_78 = local_78 + 1;
          }
        }
        else {
          pvVar10 = std::vector<GateType,_std::allocator<GateType>_>::operator[]
                              ((vector<GateType,_std::allocator<GateType>_> *)(in_RDI + 0xe),
                               (ulong)local_74);
          if (*pvVar10 == XOR) {
            pvVar11 = std::
                      vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                      ::operator[]((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                                    *)(in_RDI + 0x14),(ulong)local_74);
            pvVar7 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](pvVar11,0)
            ;
            pvVar9 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                               (&local_48,(ulong)*pvVar7);
            uVar13 = *pvVar9;
            pvVar11 = std::
                      vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                      ::operator[]((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                                    *)(in_RDI + 0x14),(ulong)local_74);
            pvVar7 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](pvVar11,1)
            ;
            pvVar9 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                               (&local_48,(ulong)*pvVar7);
            uVar4 = *pvVar9;
            pvVar11 = std::
                      vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                      ::operator[]((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                                    *)(in_RDI + 0x1a),(ulong)local_74);
            pvVar7 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](pvVar11,0)
            ;
            pvVar9 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                               (&local_48,(ulong)*pvVar7);
            *pvVar9 = uVar13 ^ uVar4;
          }
          else {
            pvVar10 = std::vector<GateType,_std::allocator<GateType>_>::operator[]
                                ((vector<GateType,_std::allocator<GateType>_> *)(in_RDI + 0xe),
                                 (ulong)local_74);
            if (*pvVar10 == EQ) {
              pvVar11 = std::
                        vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                        ::operator[]((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                                      *)(in_RDI + 0x14),(ulong)local_74);
              pvVar7 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                                 (pvVar11,0);
              uVar1 = *pvVar7;
              pvVar11 = std::
                        vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                        ::operator[]((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                                      *)(in_RDI + 0x1a),(ulong)local_74);
              pvVar7 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                                 (pvVar11,0);
              pvVar9 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                                 (&local_48,(ulong)*pvVar7);
              *pvVar9 = (ulong)uVar1;
            }
            else {
              pvVar10 = std::vector<GateType,_std::allocator<GateType>_>::operator[]
                                  ((vector<GateType,_std::allocator<GateType>_> *)(in_RDI + 0xe),
                                   (ulong)local_74);
              if (*pvVar10 == EQW) {
                pvVar11 = std::
                          vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                          ::operator[]((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                                        *)(in_RDI + 0x14),(ulong)local_74);
                pvVar7 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                                   (pvVar11,0);
                pvVar9 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                                   (&local_48,(ulong)*pvVar7);
                vVar3 = *pvVar9;
                pvVar11 = std::
                          vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                          ::operator[]((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                                        *)(in_RDI + 0x1a),(ulong)local_74);
                pvVar7 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                                   (pvVar11,0);
                pvVar9 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                                   (&local_48,(ulong)*pvVar7);
                *pvVar9 = vVar3;
              }
              else {
                pvVar10 = std::vector<GateType,_std::allocator<GateType>_>::operator[]
                                    ((vector<GateType,_std::allocator<GateType>_> *)(in_RDI + 0xe),
                                     (ulong)local_74);
                if (*pvVar10 != INV) {
                  this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
                  std::runtime_error::runtime_error(this_01,"not_implemented");
                  __cxa_throw(this_01,&std::runtime_error::typeinfo,
                              std::runtime_error::~runtime_error);
                }
                pvVar11 = std::
                          vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                          ::operator[]((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                                        *)(in_RDI + 0x14),(ulong)local_74);
                pvVar7 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                                   (pvVar11,0);
                pvVar9 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                                   (&local_48,(ulong)*pvVar7);
                uVar13 = *pvVar9;
                pvVar11 = std::
                          vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                          ::operator[]((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                                        *)(in_RDI + 0x1a),(ulong)local_74);
                pvVar7 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                                   (pvVar11,0);
                pvVar9 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                                   (&local_48,(ulong)*pvVar7);
                *pvVar9 = uVar13 ^ 1;
              }
            }
          }
        }
      }
    }
    local_68 = *in_RDI;
    local_7c = 0;
    local_80 = 0;
    while( true ) {
      uVar13 = (ulong)local_80;
      sVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(in_RDI + 8));
      if (sVar6 <= uVar13) break;
      pvVar7 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(in_RDI + 8),
                          (ulong)local_80);
      local_68 = local_68 - *pvVar7;
      local_80 = local_80 + 1;
    }
    local_84 = 0;
    while( true ) {
      in_stack_fffffffffffffec0 = (allocator_type *)(ulong)local_84;
      paVar14 = (allocator_type *)
                std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                          ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(in_RDI + 8));
      if (paVar14 <= in_stack_fffffffffffffec0) break;
      for (local_88 = 0;
          pvVar7 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                             ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(in_RDI + 8),
                              (ulong)local_84), local_88 < *pvVar7; local_88 = local_88 + 1) {
        pvVar9 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                           (&local_48,(ulong)local_68);
        in_stack_fffffffffffffeb0 = (array<unsigned_long,_1UL> *)*pvVar9;
        std::
        vector<std::array<unsigned_long,_1UL>,_std::allocator<std::array<unsigned_long,_1UL>_>_>::
        operator[](local_20,(ulong)local_7c);
        pvVar12 = std::array<unsigned_long,_1UL>::operator[]
                            (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
        *pvVar12 = (value_type_conflict3)in_stack_fffffffffffffeb0;
        local_68 = local_68 + 1;
        local_7c = local_7c + 1;
      }
      local_84 = local_84 + 1;
    }
    bVar5 = true;
  } while( true );
}

Assistant:

void Circuit::base_circuit_shares(
    const std::vector<std::array<uint64_t, PARTY64>> &witness_shares_in,
    const std::vector<std::array<uint64_t, PARTY64>> &output_mult_shares,
    std::vector<std::array<uint64_t, PARTY64>> &witness_shares_out,
    std::vector<std::array<uint64_t, PARTY64>> &right_input_mult_shares_out,
    std::vector<std::array<uint64_t, PARTY64>> &left_input_mult_shares_out)
    const {
  vector<uint64_t> W(nWires);
  for (unsigned int p = 0; p < PARTY64; p++) {
    unsigned int cntAND = 0;
    // Load inputs
    unsigned int cnt = 0;
    for (unsigned int i = 0; i < numI.size(); i++) {
      for (unsigned int j = 0; j < numI[i]; j++) {
        W[cnt] = witness_shares_in[cnt][p];
        cnt++;
      }
    }
    // Evaluate the circuit
    for (unsigned int i = 0; i < GateT.size();
         i++) { // First check if ordering is broken
      // if (GateT[i] != EQ && W[GateI[i][0]] < 0)
      //  {
      //    throw std::runtime_error("Circuit error");
      //  }
      // if (GateT[i] != INV && GateT[i] != EQ && GateT[i] != EQW)
      //  {
      //    for (unsigned int j= 1; j < GateO[i].size(); j++)
      //      {
      //        if (W[GateI[i][j]] < 0)
      //          {
      //            throw std::runtime_error("Circuit error");
      //          }
      //      }
      //  }
      // Now evaluate the gate
      if (GateT[i] == AND) {
        right_input_mult_shares_out[cntAND][p] = W[GateI[i][0]];
        left_input_mult_shares_out[cntAND][p] = W[GateI[i][1]];
        W[GateO[i][0]] = output_mult_shares[cntAND][p];
        cntAND++;
      } else if (GateT[i] == MAND) {
        for (unsigned int j = 0; j < GateO[i].size(); j++) {
          W[GateO[i][j]] = W[GateI[i][j]] & W[GateI[i][j + GateO[i].size()]];
        }
      } else if (GateT[i] == XOR) {
        W[GateO[i][0]] = W[GateI[i][0]] ^ W[GateI[i][1]];
      } else if (GateT[i] == EQ) {
        W[GateO[i][0]] = GateI[i][0];
      } else if (GateT[i] == EQW) {
        W[GateO[i][0]] = W[GateI[i][0]];
      } else if (GateT[i] == INV) {
        W[GateO[i][0]] = 1 ^ W[GateI[i][0]];
      } else {
        throw std::runtime_error("not_implemented");
      }
    }
    // Now produce the output
    // outputs.resize(total_num_out());
    cnt = nWires;
    unsigned int cntOut = 0;
    for (unsigned int i = 0; i < numO.size(); i++) {
      cnt -= numO[i];
    }
    for (unsigned int i = 0; i < numO.size(); i++) {
      // outputs[i].resize(numO[i]);
      for (unsigned int j = 0; j < numO[i]; j++) {
        witness_shares_out[cntOut][p] = W[cnt];
        cnt++;
        cntOut++;
      }
    }
  }
}